

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-split.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  size_t *psVar1;
  __node_base_ptr *pp_Var2;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  *this;
  _Rb_tree_header *p_Var3;
  string *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  pointer *ppuVar6;
  Export *pEVar7;
  pointer __n;
  undefined1 auVar8 [16];
  pointer puVar9;
  size_t wasm_00;
  bool bVar10;
  char cVar11;
  int iVar12;
  undefined8 uVar13;
  const_iterator cVar14;
  _Rb_tree_node_base *p_Var15;
  uint64_t uVar16;
  char *pcVar17;
  Instrumenter *this_00;
  ulong *puVar18;
  ostream *poVar19;
  istream *piVar20;
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
  _Var21;
  pointer pbVar22;
  long *plVar23;
  _Base_ptr p_Var24;
  long lVar25;
  long *plVar26;
  _Base_ptr keepFuncs_00;
  string *file;
  ulong uVar27;
  undefined8 *puVar28;
  long lVar29;
  undefined1 auVar30 [8];
  undefined8 *puVar31;
  ulong *puVar32;
  ulong *puVar33;
  ulong uVar34;
  pointer puVar35;
  iterator __begin2;
  iterator __end2;
  byte bVar36;
  Name NVar37;
  Name NVar38;
  Name NVar39;
  Name NVar40;
  pair<std::_Rb_tree_iterator<wasm::Name>,_std::_Rb_tree_iterator<wasm::Name>_> pVar41;
  string_view sVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>,_bool>
  pVar45;
  Name name;
  Name name_00;
  Name name_01;
  Name name_02;
  Name name_03;
  Name name_04;
  Name name_05;
  undefined1 local_f30 [8];
  Module wasm;
  WasmSplitOptions options;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> keepFuncs_1;
  undefined1 local_498 [272];
  undefined1 auStack_388 [8];
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> splitFuncs_1;
  undefined1 local_340 [16];
  __node_base local_330;
  _Hash_node_base *local_328;
  _Hash_node_base local_320;
  size_t sStack_318;
  __node_base_ptr local_310;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_308 [4];
  string local_1f8;
  undefined1 local_1d8 [8];
  anon_class_8_1_38e0b97e printFnSet;
  _Base_ptr local_1c8;
  _Rb_tree_node_base *p_Stack_1c0;
  long *local_1a8 [2];
  long local_198 [2];
  undefined1 local_188 [8];
  string currModule;
  undefined1 local_158 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string line;
  undefined1 auStack_108 [8];
  Results splitResults;
  undefined1 local_c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> splitFuncs;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> keepFuncs;
  
  bVar36 = 0;
  pp_Var2 = &wasm.tagsMap._M_h._M_single_bucket;
  ::wasm::WasmSplitOptions::WasmSplitOptions((WasmSplitOptions *)pp_Var2);
  ::wasm::WasmSplitOptions::parse((WasmSplitOptions *)pp_Var2,argc,argv);
  bVar10 = ::wasm::WasmSplitOptions::validate
                     ((WasmSplitOptions *)&wasm.tagsMap._M_h._M_single_bucket);
  auVar43._8_8_ = wasm.name.super_IString.str._M_len;
  auVar43._0_4_ = wasm.features.features;
  auVar43[4] = wasm.hasFeaturesSection;
  auVar43._5_3_ = wasm._381_3_;
  if (!bVar10) {
    ::wasm::Fatal::Fatal((Fatal *)local_f30);
    ::wasm::Fatal::operator<<((Fatal *)local_f30,(char (*) [31])"Invalid command line arguments");
LAB_0010fc44:
    ::wasm::Fatal::~Fatal((Fatal *)local_f30);
  }
  switch(options.super_ToolOptions.enabledFeatures.features) {
  case 0:
    ::wasm::Module::Module((Module *)local_f30);
    anon_unknown.dwarf_3e821::parseInput
              ((Module *)local_f30,(WasmSplitOptions *)&wasm.tagsMap._M_h._M_single_bucket);
    puVar9 = wasm.functions.
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&keepFuncs;
    keepFuncs._M_t._M_impl._0_4_ = 0;
    keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    keepFuncs_00 = (_Base_ptr)&splitFuncs;
    splitFuncs._M_t._M_impl._0_4_ = 0;
    splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = keepFuncs_00;
    splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = keepFuncs_00;
    keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (options.profileFile._M_dataplus._M_p == (pointer)0x0) {
      if (((char)options.splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count == '\x01') &&
         ((options.splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count._1_1_ & 1) == 0)) {
        if (wasm.exports.
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage !=
            (pointer)wasm.functions.
                     super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) {
          puVar35 = wasm.exports.
                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          do {
            pEVar7 = (puVar35->_M_t).
                     super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                     super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
            if (*(long *)((long)&(pEVar7->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 8
                         ) == 0) {
              std::
              _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
              ::_M_insert_unique<wasm::Name_const&>
                        ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                          *)(__str_1.field_2._M_local_buf + 8),&pEVar7->name);
            }
            puVar35 = puVar35 + 1;
          } while (puVar35 != (pointer)puVar9);
        }
      }
      else if (wasm.exports.
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage !=
               (pointer)wasm.functions.
                        super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) {
        puVar35 = wasm.exports.
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        do {
          pEVar7 = (puVar35->_M_t).
                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                   super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
          if (*(long *)((long)&(pEVar7->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 8)
              == 0) {
            std::
            _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
            ::_M_insert_unique<wasm::Name_const&>
                      ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                        *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,&pEVar7->name
                      );
          }
          puVar35 = puVar35 + 1;
        } while (puVar35 != (pointer)puVar9);
      }
    }
    else {
      uVar16 = anon_unknown.dwarf_3e821::hashFile((string *)options._560_8_);
      keepFuncs_00 = (_Base_ptr)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count;
      anon_unknown.dwarf_3e821::getFunctionsToKeepAndSplit
                ((Module *)local_f30,uVar16,(string *)&options.usePlaceholders,
                 (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)keepFuncs_00
                 ,(set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                  ((long)&__str_1.field_2 + 8));
    }
    if (options.keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
        (_Base_ptr)&options.keepFuncs) {
      this = (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              *)((long)&__str_1.field_2 + 8);
      p_Var24 = options.keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        NVar37.super_IString.str._M_str = *(char **)(p_Var24 + 1);
        NVar37.super_IString.str._M_len = (size_t)local_f30;
        lVar25 = ::wasm::Module::getFunctionOrNull(NVar37);
        if (lVar25 == 0) {
          if ((char)options.super_ToolOptions.passOptions.passesToSkip._M_h._M_single_bucket == '\0'
             ) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"warning: function ",0x12);
            name.super_IString.str._M_str = (char *)keepFuncs_00;
            name.super_IString.str._M_len = (size_t)p_Var24[1]._M_parent;
            poVar19 = ::wasm::operator<<((wasm *)&std::cerr,*(ostream **)(p_Var24 + 1),name);
            std::__ostream_insert<char,std::char_traits<char>>(poVar19," does not exist\n",0x10);
          }
        }
        else {
          std::
          _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
          ::_M_insert_unique<wasm::Name_const&>
                    ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                      *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (Name *)(p_Var24 + 1));
          pVar41 = std::
                   _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   ::equal_range(this,(key_type *)(p_Var24 + 1));
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::_M_erase_aux(this,(_Base_ptr)pVar41.first._M_node,(_Base_ptr)pVar41.second._M_node);
        }
        p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24);
      } while (p_Var24 != (_Base_ptr)&options.keepFuncs);
    }
    if (options.splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
        (_Base_ptr)&options.splitFuncs) {
      p_Var24 = options.splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        NVar38.super_IString.str._M_str = *(char **)(p_Var24 + 1);
        NVar38.super_IString.str._M_len = (size_t)local_f30;
        lVar25 = ::wasm::Module::getFunctionOrNull(NVar38);
        if (lVar25 == 0) {
          if ((char)options.super_ToolOptions.passOptions.passesToSkip._M_h._M_single_bucket == '\0'
             ) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"warning: function ",0x12);
            name_01.super_IString.str._M_str = (char *)keepFuncs_00;
            name_01.super_IString.str._M_len = (size_t)p_Var24[1]._M_parent;
            poVar19 = ::wasm::operator<<((wasm *)&std::cerr,*(ostream **)(p_Var24 + 1),name_01);
            lVar25 = 0x10;
            pcVar17 = " does not exist\n";
LAB_0010dd56:
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,pcVar17,lVar25);
          }
        }
        else if (*(long *)(lVar25 + 0x20) == 0) {
          p_Var15 = p_Var24 + 1;
          if ((char)options.super_ToolOptions.passOptions.passesToSkip._M_h._M_single_bucket == '\0'
             ) {
            cVar14 = std::
                     _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                     ::find((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                             *)((long)&options.profileExport.field_2 + 8),(key_type *)p_Var15);
            keepFuncs_00 = (_Base_ptr)&options.keepFuncs;
            if (cVar14._M_node != keepFuncs_00) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"warning: function ",0x12);
              name_02.super_IString.str._M_str = (char *)keepFuncs_00;
              name_02.super_IString.str._M_len = (size_t)p_Var24[1]._M_parent;
              poVar19 = ::wasm::operator<<((wasm *)&std::cerr,*(ostream **)(p_Var24 + 1),name_02);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar19," was to be both kept and split. It will be split.\n",0x32);
            }
          }
          std::
          _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
          ::_M_insert_unique<wasm::Name_const&>
                    ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                      *)(__str_1.field_2._M_local_buf + 8),(Name *)p_Var15);
          pVar41 = std::
                   _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   ::equal_range((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                  *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                 (key_type *)p_Var15);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::_M_erase_aux((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                          *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (_Base_ptr)pVar41.first._M_node,(_Base_ptr)pVar41.second._M_node);
        }
        else if ((char)options.super_ToolOptions.passOptions.passesToSkip._M_h._M_single_bucket ==
                 '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"warning: cannot split out imported function ",0x2c);
          name_00.super_IString.str._M_str = (char *)keepFuncs_00;
          name_00.super_IString.str._M_len = (size_t)p_Var24[1]._M_parent;
          poVar19 = ::wasm::operator<<((wasm *)&std::cerr,*(ostream **)(p_Var24 + 1),name_00);
          lVar25 = 1;
          pcVar17 = "\n";
          goto LAB_0010dd56;
        }
        p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24);
      } while (p_Var24 != (_Base_ptr)&options.splitFuncs);
    }
    if (((char)options.super_ToolOptions.passOptions.passesToSkip._M_h._M_single_bucket == '\0') &&
       (keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_right == (_Base_ptr)0x0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"warning: not keeping any functions in the primary module\n",
                 0x39);
    }
    if (options.storageKind._2_1_ == 1) {
      std::
      _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
      ::_M_insert_unique<wasm::Name_const&>
                ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                  *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (Name *)::wasm::ModuleSplitting::LOAD_SECONDARY_MODULE);
      pVar41 = std::
               _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               ::equal_range((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                              *)((long)&__str_1.field_2 + 8),
                             (key_type *)::wasm::ModuleSplitting::LOAD_SECONDARY_MODULE);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::_M_erase_aux((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                      *)((long)&__str_1.field_2 + 8),(_Base_ptr)pVar41.first._M_node,
                     (_Base_ptr)pVar41.second._M_node);
    }
    if (((char)options.super_ToolOptions.passOptions.passesToSkip._M_h._M_single_bucket == '\0') &&
       (splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_right == (_Base_ptr)0x0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "warning: not splitting any functions out to the secondary module\n",0x41);
    }
    if (options.mode._2_1_ == 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Keeping functions: ",0x13);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                  *)local_188,
                 (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                  *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
      for (uVar13 = currModule.field_2._M_allocated_capacity;
          (_Rb_tree_node_base *)uVar13 != (_Rb_tree_node_base *)&currModule;
          uVar13 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar13)) {
        if (uVar13 != currModule.field_2._M_allocated_capacity) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
        }
        name_03.super_IString.str._M_str = (char *)keepFuncs_00;
        name_03.super_IString.str._M_len =
             (size_t)((_Rb_tree_node_base *)(uVar13 + 0x20))->_M_parent;
        ::wasm::operator<<((wasm *)&std::cout,*(ostream **)(uVar13 + 0x20),name_03);
      }
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)local_188);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Splitting out functions: ",0x19);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                  *)((long)&__str.field_2 + 8),
                 (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                  *)((long)&__str_1.field_2 + 8));
      for (uVar13 = line.field_2._M_allocated_capacity;
          (_Rb_tree_node_base *)uVar13 != (_Rb_tree_node_base *)&line;
          uVar13 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar13)) {
        if (uVar13 != line.field_2._M_allocated_capacity) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
        }
        name_04.super_IString.str._M_str = (char *)keepFuncs_00;
        name_04.super_IString.str._M_len =
             (size_t)((_Rb_tree_node_base *)(uVar13 + 0x20))->_M_parent;
        ::wasm::operator<<((wasm *)&std::cout,*(ostream **)(uVar13 + 0x20),name_04);
      }
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)((long)&__str.field_2 + 8));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    }
    if (wasm.exports.
        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage !=
        (pointer)wasm.functions.
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) {
      puVar35 = wasm.exports.
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      do {
        pEVar7 = (puVar35->_M_t).
                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                 super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
        if (*(long *)((long)&(pEVar7->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 8) ==
            0) {
          cVar14 = std::
                   _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   ::find((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                           *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          &pEVar7->name);
          keepFuncs_00 = (_Base_ptr)&keepFuncs;
          if (cVar14._M_node == keepFuncs_00) {
            cVar14 = std::
                     _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                     ::find((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                             *)((long)&__str_1.field_2 + 8),&pEVar7->name);
            keepFuncs_00 = (_Base_ptr)&splitFuncs;
            if (cVar14._M_node == keepFuncs_00) {
              __assert_fail("keepFuncs.count(func->name) || splitFuncs.count(func->name)",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/wasm-split.cpp"
                            ,0x13c,
                            "auto (anonymous namespace)::splitModule(const WasmSplitOptions &)::(anonymous class)::operator()(Function *) const"
                           );
            }
          }
        }
        puVar35 = puVar35 + 1;
      } while (puVar35 !=
               (pointer)wasm.functions.
                        super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    }
    splitFuncs_1._M_t._M_impl._0_8_ = (ulong)(uint)splitFuncs_1._M_t._M_impl._4_4_ << 0x20;
    splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = 1;
    splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&splitFuncs_1;
    splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&splitFuncs_1;
    ::wasm::IString::interned(7,"primary",0);
    local_340 = ::wasm::IString::interned(0xb,"placeholder",0);
    local_328 = (_Hash_node_base *)0x0;
    local_320._M_nxt = local_320._M_nxt & 0xffffffffffffff00;
    local_310 = (__node_base_ptr)((ulong)local_310 & 0xffffffffffff0000);
    local_330._M_nxt = &local_320;
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::clear((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
             *)auStack_388);
    if (splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
      splitFuncs_1._M_t._M_impl._0_4_ = splitFuncs._M_t._M_impl._0_4_;
      splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
           splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
      splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      *(_Base_ptr *)(splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 8) =
           (_Base_ptr)&splitFuncs_1;
      splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      keepFuncs_00 = (_Base_ptr)&splitFuncs;
      splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = keepFuncs_00;
      splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = keepFuncs_00;
    }
    if (options.importNamespace._M_dataplus._M_p != (pointer)0x0) {
      ::wasm::IString::interned
                (options.importNamespace._M_dataplus._M_p,options.secondaryOutput.field_2._8_8_,0);
    }
    auVar43 = local_340;
    if (options.placeholderNamespace._M_dataplus._M_p != (pointer)0x0) {
      auVar43 = ::wasm::IString::interned
                          (options.placeholderNamespace._M_dataplus._M_p,
                           options.importNamespace.field_2._8_8_,0);
    }
    local_340 = auVar43;
    if (options.exportPrefix._M_dataplus._M_p != (pointer)0x0) {
      std::__cxx11::string::_M_assign((string *)&local_330);
    }
    pcVar17 = (char *)CONCAT71((int7)((ulong)keepFuncs_00 >> 8),(undefined1)options.mode);
    splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = (undefined1)options.mode;
    local_310 = (__node_base_ptr)
                (CONCAT62(local_310._2_6_,
                          CONCAT11(options.storageKind._2_1_,
                                   options.super_ToolOptions.passOptions.inlining.partialInliningIfs
                                   ._2_1_)) ^ 1);
    ::wasm::ModuleSplitting::splitFunctions((Module *)auStack_108,(Config *)local_f30);
    anon_unknown.dwarf_3e821::adjustTableSize
              ((Module *)local_f30,options.outPrefix.field_2._8_4_,false);
    anon_unknown.dwarf_3e821::adjustTableSize
              ((Module *)auStack_108,options.outPrefix.field_2._8_4_,true);
    if ((undefined1)options.storageKind == InMemory) {
      local_158 = (undefined1  [8])&__str._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_158,options.output.field_2._8_8_,
                 options.primaryOutput._M_dataplus._M_p + options.output.field_2._8_8_);
      std::__cxx11::string::append(local_158);
      anon_unknown.dwarf_3e821::writeSymbolMap((Module *)local_f30,(string *)local_158);
      if (local_158 != (undefined1  [8])&__str._M_string_length) {
        operator_delete((void *)local_158,__str._M_string_length + 1);
      }
      auVar30 = auStack_108;
      local_c0 = (undefined1  [8])&__str_1._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_c0,options.primaryOutput.field_2._8_8_,
                 options.secondaryOutput._M_dataplus._M_p + options.primaryOutput.field_2._8_8_);
      std::__cxx11::string::append(local_c0);
      anon_unknown.dwarf_3e821::writeSymbolMap((Module *)auVar30,(string *)local_c0);
      if (local_c0 != (undefined1  [8])&__str_1._M_string_length) {
        operator_delete((void *)local_c0,__str_1._M_string_length + 1);
      }
    }
    if (options.storageKind._1_1_ == 1) {
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_wasm::Name>,_std::_Select1st<std::pair<const_unsigned_long,_wasm::Name>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
      ::_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_wasm::Name>,_std::_Select1st<std::pair<const_unsigned_long,_wasm::Name>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
                  *)local_1d8,
                 (_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_wasm::Name>,_std::_Select1st<std::pair<const_unsigned_long,_wasm::Name>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
                  *)&splitResults);
      local_1a8[0] = local_198;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,options.output.field_2._8_8_,
                 options.primaryOutput._M_dataplus._M_p + options.output.field_2._8_8_);
      std::__cxx11::string::append((char *)local_1a8);
      ::wasm::Output::Output
                ((Output *)
                 &options.usedOptions.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_1a8,Text);
      if (p_Stack_1c0 != (_Rb_tree_node_base *)&printFnSet) {
        p_Var15 = p_Stack_1c0;
        do {
          poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)local_498);
          local_1f8._M_dataplus._M_p._0_1_ = 0x3a;
          poVar19 = std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_1f8,1)
          ;
          name_05.super_IString.str._M_str = pcVar17;
          name_05.super_IString.str._M_len = (size_t)p_Var15[1]._M_left;
          poVar19 = ::wasm::operator<<((wasm *)poVar19,(ostream *)p_Var15[1]._M_parent,name_05);
          local_1f8._M_dataplus._M_p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_1f8,1);
          p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
        } while (p_Var15 != (_Rb_tree_node_base *)&printFnSet);
      }
      ::wasm::Output::~Output
                ((Output *)
                 &options.usedOptions.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (local_1a8[0] != local_198) {
        operator_delete(local_1a8[0],local_198[0] + 1);
      }
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_wasm::Name>,_std::_Select1st<std::pair<const_unsigned_long,_wasm::Name>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_wasm::Name>,_std::_Select1st<std::pair<const_unsigned_long,_wasm::Name>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
                   *)local_1d8);
    }
    if (options.storageKind._3_1_ == 1) {
      if (wasm.name.super_IString.str._M_len == 0) {
        ::wasm::Path::getBaseName
                  ((string *)
                   &options.usedOptions.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        wasm._376_16_ =
             ::wasm::IString::interned
                       (CONCAT44(keepFuncs_1._M_t._M_impl._4_4_,keepFuncs_1._M_t._M_impl._0_4_),
                        options.usedOptions.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
        if ((_Rb_tree_header *)
            options.usedOptions.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage !=
            &keepFuncs_1._M_t._M_impl.super__Rb_tree_header) {
          operator_delete(options.usedOptions.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
        }
      }
      ::wasm::Path::getBaseName
                ((string *)
                 &options.usedOptions.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      sVar42 = (string_view)
               ::wasm::IString::interned
                         (CONCAT44(keepFuncs_1._M_t._M_impl._4_4_,keepFuncs_1._M_t._M_impl._0_4_),
                          options.usedOptions.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
      (((Name *)((long)auStack_108 + 0x180))->super_IString).str = sVar42;
      if ((_Rb_tree_header *)
          options.usedOptions.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage !=
          &keepFuncs_1._M_t._M_impl.super__Rb_tree_header) {
        operator_delete(options.usedOptions.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
      }
    }
    p_Var3 = &keepFuncs_1._M_t._M_impl.super__Rb_tree_header;
    options.usedOptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)p_Var3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               &options.usedOptions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,options.output.field_2._8_8_,
               options.primaryOutput._M_dataplus._M_p + options.output.field_2._8_8_);
    anon_unknown.dwarf_3e821::writeModule
              ((Module *)local_f30,
               (string *)
               &options.usedOptions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (WasmSplitOptions *)&wasm.tagsMap._M_h._M_single_bucket);
    if ((_Rb_tree_header *)
        options.usedOptions.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != p_Var3) {
      operator_delete(options.usedOptions.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
    }
    auVar30 = auStack_108;
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,options.primaryOutput.field_2._8_8_,
               options.secondaryOutput._M_dataplus._M_p + options.primaryOutput.field_2._8_8_);
    anon_unknown.dwarf_3e821::writeModule
              ((Module *)auVar30,&local_1f8,(WasmSplitOptions *)&wasm.tagsMap._M_h._M_single_bucket)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_wasm::Name>,_std::_Select1st<std::pair<const_unsigned_long,_wasm::Name>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_wasm::Name>,_std::_Select1st<std::pair<const_unsigned_long,_wasm::Name>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
                 *)&splitResults);
    std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::~unique_ptr
              ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)auStack_108);
    if (local_330._M_nxt != &local_320) {
      operator_delete(local_330._M_nxt,(ulong)((long)&(local_320._M_nxt)->_M_nxt + 1));
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)auStack_388);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)((long)&__str_1.field_2 + 8));
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    auVar8 = (undefined1  [16])wasm._376_16_;
    break;
  case 1:
    if (options.manifestFile._M_dataplus._M_p == (pointer)0x0) {
      ::wasm::Fatal::Fatal((Fatal *)local_f30);
      ::wasm::Fatal::operator<<
                ((Fatal *)local_f30,(char (*) [34])"--multi-split requires --manifest");
    }
    else if (options.output._M_dataplus._M_p == (pointer)0x0) {
      ::wasm::Fatal::Fatal((Fatal *)local_f30);
      ::wasm::Fatal::operator<<((Fatal *)local_f30,(char (*) [32])"--multi-split requires --output")
      ;
    }
    else {
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (options.exportPrefix.field_2._M_local_buf + 8);
      std::ifstream::ifstream
                (&options.usedOptions.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pbVar5,_S_in);
      cVar11 = std::__basic_file<char>::is_open();
      if (cVar11 != '\0') {
        ::wasm::Module::Module((Module *)local_f30);
        anon_unknown.dwarf_3e821::parseInput
                  ((Module *)local_f30,(WasmSplitOptions *)&wasm.tagsMap._M_h._M_single_bucket);
        splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&splitFuncs;
        splitFuncs._M_t._M_impl._0_4_ = 0;
        pbVar22 = (pointer)0x0;
        splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
        local_188 = (undefined1  [8])&currModule._M_string_length;
        currModule._M_dataplus._M_p = (pointer)0x0;
        currModule._M_string_length._0_1_ = 0;
        auStack_108 = (undefined1  [8])
                      &splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_right;
        splitResults.secondary._M_t.
        super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
        super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl =
             (__uniq_ptr_data<wasm::Module,_std::default_delete<wasm::Module>,_true,_true>)
             (__uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>)0x1;
        splitResults.placeholderMap._M_t._M_impl._0_8_ = 0;
        splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ =
             0x3f800000;
        splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)0x0;
        splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)0x0;
        __str.field_2._8_8_ = &line._M_string_length;
        line._M_dataplus._M_p = (pointer)0x0;
        line._M_string_length._0_1_ = 0;
        bVar10 = true;
        pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (__str.field_2._M_local_buf + 8);
        splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        while( true ) {
          cVar11 = std::ios::widen((char)options.usedOptions.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage[-1].
                                         _M_string_length + (char)&options + -0x60);
          piVar20 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)
                               &options.usedOptions.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pbVar5,
                               cVar11);
          if (((byte)piVar20[*(long *)(*(long *)piVar20 + -0x18) + 0x20] & 5) != 0) break;
          if (line._M_dataplus._M_p == (pointer)0x0) {
            bVar10 = true;
          }
          else if (bVar10) {
            std::__cxx11::string::_M_assign((string *)local_188);
            bVar10 = false;
            pbVar22 = (pointer)std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                             *)((long)&__str_1.field_2 + 8),pbVar5);
          }
          else {
            if (pbVar22 == (pointer)0x0) {
              __assert_fail("currFuncs",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/wasm-split.cpp"
                            ,0x194,
                            "void (anonymous namespace)::multiSplitModule(const WasmSplitOptions &)"
                           );
            }
            auStack_388 = (undefined1  [8])pbVar22;
            std::
            _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                      ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)pbVar22,pbVar5,
                       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)auStack_388);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                      ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)auStack_388,pbVar5,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_188);
            pVar45 = std::
                     _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                     ::_M_emplace<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                               ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                                 *)auStack_108,
                                (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)auStack_388);
            _Var21 = pVar45.first.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                     ._M_cur;
            if (splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
                (_Base_ptr)&splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_node_count) {
              operator_delete(splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                              CONCAT71(splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_node_count
                                       ._1_7_,(undefined1)
                                              splitFuncs_1._M_t._M_impl.super__Rb_tree_header.
                                              _M_node_count) + 1);
            }
            if (auStack_388 != (undefined1  [8])&splitFuncs_1._M_t._M_impl.super__Rb_tree_header) {
              operator_delete((void *)auStack_388,
                              splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
            }
            if (((undefined1  [16])pVar45 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              __n = *(pointer *)
                     ((long)_Var21.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                            ._M_cur + 0x30);
              if ((__n != currModule._M_dataplus._M_p) ||
                 ((__n != (pointer)0x0 &&
                  (iVar12 = bcmp(*(void **)((long)_Var21.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                                  ._M_cur + 0x28),(void *)local_188,(size_t)__n),
                  iVar12 != 0)))) {
                ::wasm::Fatal::Fatal((Fatal *)auStack_388);
                p_Var3 = &splitFuncs_1._M_t._M_impl.super__Rb_tree_header;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)p_Var3,"Function ",9);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)p_Var3,(char *)__str.field_2._8_8_,(long)line._M_dataplus._M_p
                          );
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)p_Var3,"cannot be assigned to module ",0x1d);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)p_Var3,(char *)local_188,(long)currModule._M_dataplus._M_p);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)p_Var3,"; it is already assigned to module ",0x23);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)p_Var3,
                           *(char **)((long)_Var21.
                                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                            ._M_cur + 0x28),
                           *(long *)((long)_Var21.
                                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                           ._M_cur + 0x30));
                splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count =
                     CONCAT71(splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_,10);
                ::wasm::Fatal::operator<<
                          ((Fatal *)auStack_388,
                           (char *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
                ::wasm::Fatal::~Fatal((Fatal *)auStack_388);
              }
            }
            else if ((char)options.super_ToolOptions.passOptions.passesToSkip._M_h._M_single_bucket
                     == '\0') {
              pcVar17 = (char *)::wasm::IString::interned
                                          (line._M_dataplus._M_p,__str.field_2._8_8_,0);
              NVar40.super_IString.str._M_str = pcVar17;
              NVar40.super_IString.str._M_len = (size_t)local_f30;
              lVar25 = ::wasm::Module::getFunctionOrNull(NVar40);
              if (lVar25 == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"warning: Function ",0x12);
                poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,(char *)__str.field_2._8_8_,
                                     (long)line._M_dataplus._M_p);
                std::__ostream_insert<char,std::char_traits<char>>(poVar19," does not exist\n",0x10)
                ;
              }
            }
          }
        }
        splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&splitFuncs_1;
        splitFuncs_1._M_t._M_impl._0_8_ = splitFuncs_1._M_t._M_impl._0_8_ & 0xffffffff00000000;
        splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
        splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = 1;
        splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        ::wasm::IString::interned(7,"primary",0);
        local_340 = ::wasm::IString::interned(0xb,"placeholder",0);
        local_330._M_nxt = &local_320;
        local_328 = (_Hash_node_base *)0x0;
        local_320._M_nxt = local_320._M_nxt & 0xffffffffffffff00;
        local_310 = (__node_base_ptr)((ulong)local_310 & 0xffffffffffff0000);
        splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = Split;
        ::wasm::IString::interned(0,"",0);
        local_310 = (__node_base_ptr)CONCAT71(local_310._1_7_,1);
        if (splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
            (_Base_ptr)&splitFuncs) {
          psVar1 = &splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count;
          p_Var24 = splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          do {
            if (options.mode._2_1_ == 1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Splitting module ",0x11);
              poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,*(char **)(p_Var24 + 1),
                                   (long)p_Var24[1]._M_parent);
              splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count =
                   CONCAT71(splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_,10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)psVar1,1);
            }
            if (((char)options.super_ToolOptions.passOptions.passesToSkip._M_h._M_single_bucket ==
                 '\0') && (p_Var24[2]._M_right == (_Base_ptr)0x0)) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"warning: Module ",0x10);
              poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,*(char **)(p_Var24 + 1),
                                   (long)p_Var24[1]._M_parent);
              std::__ostream_insert<char,std::char_traits<char>>(poVar19," will be empty\n",0xf);
            }
            std::set<wasm::Name,std::less<wasm::Name>,std::allocator<wasm::Name>>::
            set<std::__detail::_Node_iterator<std::__cxx11::string,true,true>>
                      ((set<wasm::Name,std::less<wasm::Name>,std::allocator<wasm::Name>> *)psVar1,
                       (_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                        )p_Var24[2]._M_left,
                       (_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                        )0x0);
            std::
            _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
            ::clear((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)auStack_388);
            if (keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
              splitFuncs_1._M_t._M_impl._0_4_ = keepFuncs._M_t._M_impl._0_4_;
              splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                   keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
              splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
                   keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
              splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              *(set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> **)
               (keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 8) = &splitFuncs_1;
              splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
              keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
              keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)&keepFuncs;
              keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
              keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            }
            std::
            _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
            ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                         *)psVar1);
            ::wasm::ModuleSplitting::splitFunctions((Module *)psVar1,(Config *)local_f30);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_158,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&options.manifestFile.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var24 + 1));
            plVar23 = (long *)std::__cxx11::string::append((char *)local_158);
            plVar26 = plVar23 + 2;
            if ((__node_base_ptr *)*plVar23 == (__node_base_ptr *)plVar26) {
              local_1c8 = (_Base_ptr)*plVar26;
              p_Stack_1c0 = (_Rb_tree_node_base *)plVar23[3];
              local_1d8 = (undefined1  [8])&local_1c8;
            }
            else {
              local_1c8 = (_Base_ptr)*plVar26;
              local_1d8 = (undefined1  [8])*plVar23;
            }
            printFnSet.options = (WasmSplitOptions *)plVar23[1];
            *plVar23 = (long)plVar26;
            plVar23[1] = 0;
            *(undefined1 *)(plVar23 + 2) = 0;
            if (local_158 != (undefined1  [8])&__str._M_string_length) {
              operator_delete((void *)local_158,__str._M_string_length + 1);
            }
            wasm_00 = splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count;
            local_c0 = (undefined1  [8])&__str_1._M_string_length;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_c0,local_1d8,
                       (undefined1 *)
                       ((long)&((printFnSet.options)->super_ToolOptions)._vptr_ToolOptions +
                       (long)local_1d8));
            anon_unknown.dwarf_3e821::writeModule
                      ((Module *)wasm_00,(string *)local_c0,
                       (WasmSplitOptions *)&wasm.tagsMap._M_h._M_single_bucket);
            if (local_c0 != (undefined1  [8])&__str_1._M_string_length) {
              operator_delete((void *)local_c0,__str_1._M_string_length + 1);
            }
            if (local_1d8 != (undefined1  [8])&local_1c8) {
              operator_delete((void *)local_1d8,(ulong)((long)&local_1c8->_M_color + 1));
            }
            std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_wasm::Name>,_std::_Select1st<std::pair<const_unsigned_long,_wasm::Name>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
            ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_wasm::Name>,_std::_Select1st<std::pair<const_unsigned_long,_wasm::Name>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
                         *)&keepFuncs);
            std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::~unique_ptr
                      ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)psVar1);
            p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24);
          } while (p_Var24 != (_Rb_tree_node_base *)&splitFuncs);
        }
        p_Var3 = &keepFuncs._M_t._M_impl.super__Rb_tree_header;
        splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)p_Var3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   options.inputFiles.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   options.output._M_dataplus._M_p +
                   (long)options.inputFiles.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        anon_unknown.dwarf_3e821::writeModule
                  ((Module *)local_f30,
                   (string *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (WasmSplitOptions *)&wasm.tagsMap._M_h._M_single_bucket);
        if ((_Rb_tree_header *)splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count != p_Var3
           ) {
          operator_delete((void *)splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
        }
        if (local_330._M_nxt != &local_320) {
          operator_delete(local_330._M_nxt,(ulong)((long)&(local_320._M_nxt)->_M_nxt + 1));
        }
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)auStack_388);
        if ((size_type *)__str.field_2._8_8_ != &line._M_string_length) {
          operator_delete((void *)__str.field_2._8_8_,
                          CONCAT62(line._M_string_length._2_6_,
                                   CONCAT11(line._M_string_length._1_1_,
                                            (undefined1)line._M_string_length)) + 1);
        }
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)auStack_108);
        if (local_188 != (undefined1  [8])&currModule._M_string_length) {
          operator_delete((void *)local_188,
                          CONCAT62(currModule._M_string_length._2_6_,
                                   CONCAT11(currModule._M_string_length._1_1_,
                                            (undefined1)currModule._M_string_length)) + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     *)((long)&__str_1.field_2 + 8));
        ::wasm::Module::~Module((Module *)local_f30);
        std::ifstream::~ifstream
                  (&options.usedOptions.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        auVar43._8_8_ = wasm.name.super_IString.str._M_len;
        auVar43._0_4_ = wasm.features.features;
        auVar43[4] = wasm.hasFeaturesSection;
        auVar43._5_3_ = wasm._381_3_;
        goto switchD_0010db45_default;
      }
      ::wasm::Fatal::Fatal((Fatal *)local_f30);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 &wasm.exports.
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish,"File not found: ",0x10);
      ::wasm::Fatal::operator<<((Fatal *)local_f30,pbVar5);
    }
    goto LAB_0010fc44;
  case 2:
    ::wasm::Module::Module((Module *)local_f30);
    anon_unknown.dwarf_3e821::parseInput
              ((Module *)local_f30,(WasmSplitOptions *)&wasm.tagsMap._M_h._M_single_bucket);
    pcVar17 = (char *)::wasm::IString::interned
                                (options.profileExport._M_dataplus._M_p,
                                 options.profileFile.field_2._8_8_,0);
    NVar39.super_IString.str._M_str = pcVar17;
    NVar39.super_IString.str._M_len = (size_t)local_f30;
    lVar25 = ::wasm::Module::getExportOrNull(NVar39);
    if (lVar25 != 0) {
      ::wasm::Fatal::Fatal
                ((Fatal *)&options.usedOptions.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      p_Var3 = &keepFuncs_1._M_t._M_impl.super__Rb_tree_header;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)p_Var3,"error: Export ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)p_Var3,(char *)options.profileFile.field_2._8_8_,
                 (long)options.profileExport._M_dataplus._M_p);
      ::wasm::Fatal::operator<<
                ((Fatal *)&options.usedOptions.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (char (*) [17])" already exists.");
      ::wasm::Fatal::~Fatal
                ((Fatal *)&options.usedOptions.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    uVar16 = anon_unknown.dwarf_3e821::hashFile((string *)options._560_8_);
    auVar43 = ::wasm::IString::interned(3,"env",0);
    splitResults.secondary._M_t.
    super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
    super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl = auVar43._8_8_;
    auStack_108 = auVar43._0_8_;
    splitResults.placeholderMap._M_t._M_impl._0_16_ =
         ::wasm::IString::interned(0xc,"profile-data",0);
    psVar4 = (string *)
             &splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
    psVar1 = &splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
    splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)psVar1;
    std::__cxx11::string::_M_construct<char*>
              (psVar4,::wasm::DEFAULT_PROFILE_EXPORT_abi_cxx11_,
               DAT_0012e400 + ::wasm::DEFAULT_PROFILE_EXPORT_abi_cxx11_);
    auVar44._8_8_ =
         splitResults.secondary._M_t.
         super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
         super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
    auVar44._0_8_ = auStack_108;
    if (options.importNamespace._M_dataplus._M_p != (pointer)0x0) {
      auVar44 = ::wasm::IString::interned
                          (options.importNamespace._M_dataplus._M_p,
                           options.secondaryOutput.field_2._8_8_,0);
    }
    splitResults.secondary._M_t.
    super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
    super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl = auVar44._8_8_;
    auStack_108 = auVar44._0_8_;
    auVar43 = (undefined1  [16])splitResults.placeholderMap._M_t._M_impl._0_16_;
    if (options.secondaryMemoryName._M_dataplus._M_p != (pointer)0x0) {
      auVar43 = ::wasm::IString::interned
                          (options.secondaryMemoryName._M_dataplus._M_p,
                           options.placeholderNamespace.field_2._8_8_,0);
      auVar44._8_8_ =
           splitResults.secondary._M_t.
           super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
           super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
      auVar44._0_8_ = auStack_108;
    }
    splitResults.secondary._M_t.
    super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
    super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl = auVar44._8_8_;
    auStack_108 = auVar44._0_8_;
    splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ =
         options.super_ToolOptions.disabledFeatures.features;
    splitResults.placeholderMap._M_t._M_impl._0_16_ = auVar43;
    std::__cxx11::string::_M_assign(psVar4);
    puVar28 = (undefined8 *)&options.super_ToolOptions.field_0xb0;
    puVar31 = (undefined8 *)auStack_388;
    for (lVar25 = 8; lVar25 != 0; lVar25 = lVar25 + -1) {
      *puVar31 = *puVar28;
      puVar28 = puVar28 + (ulong)bVar36 * -2 + 1;
      puVar31 = puVar31 + (ulong)bVar36 * -2 + 1;
    }
    local_340._0_8_ = (__buckets_ptr)0x0;
    local_340._8_8_ = options.super_ToolOptions.passOptions.arguments._M_h._M_buckets;
    local_330._M_nxt = (_Hash_node_base *)0x0;
    local_328 = options.super_ToolOptions.passOptions.arguments._M_h._M_before_begin._M_nxt;
    local_320._M_nxt =
         (_Hash_node_base *)options.super_ToolOptions.passOptions.arguments._M_h._M_element_count;
    sStack_318 = options.super_ToolOptions.passOptions.arguments._M_h._M_rehash_policy._0_8_;
    local_310 = (__node_base_ptr)0x0;
    splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_340;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)local_340,
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&options.super_ToolOptions.passOptions.targetJS,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
                *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    local_308[0]._M_buckets = (__buckets_ptr)0x0;
    local_308[0]._M_bucket_count =
         (size_type)options.super_ToolOptions.passOptions.passesToSkip._M_h._M_buckets;
    local_308[0]._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_308[0]._M_element_count =
         (size_type)options.super_ToolOptions.passOptions.passesToSkip._M_h._M_before_begin._M_nxt;
    local_308[0]._M_rehash_policy._0_8_ =
         options.super_ToolOptions.passOptions.passesToSkip._M_h._M_element_count;
    local_308[0]._M_rehash_policy._M_next_resize =
         options.super_ToolOptions.passOptions.passesToSkip._M_h._M_rehash_policy._0_8_;
    local_308[0]._M_single_bucket = (__node_base_ptr)0x0;
    splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_308;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_308,
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&options.super_ToolOptions.passOptions.arguments._M_h._M_single_bucket,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    ::wasm::PassRunner::PassRunner
              ((PassRunner *)
               &options.usedOptions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(Module *)local_f30,
               (PassOptions *)auStack_388);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(local_308);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_340);
    this_00 = (Instrumenter *)operator_new(0xa8);
    ::wasm::Instrumenter::Instrumenter(this_00,(InstrumenterConfig *)auStack_108,uVar16);
    __str_1.field_2._8_8_ = this_00;
    ::wasm::PassRunner::add
              ((PassRunner *)
               &options.usedOptions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)
               ((long)&__str_1.field_2 + 8));
    if (__str_1.field_2._8_8_ != 0) {
      (**(code **)(*(long *)__str_1.field_2._8_8_ + 8))();
    }
    __str_1.field_2._8_8_ = 0;
    ::wasm::PassRunner::run();
    anon_unknown.dwarf_3e821::adjustTableSize
              ((Module *)local_f30,options.outPrefix.field_2._8_4_,false);
    p_Var3 = &keepFuncs._M_t._M_impl.super__Rb_tree_header;
    splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)p_Var3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
               options.inputFiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
               options.output._M_dataplus._M_p +
               (long)options.inputFiles.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    anon_unknown.dwarf_3e821::writeModule
              ((Module *)local_f30,
               (string *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (WasmSplitOptions *)&wasm.tagsMap._M_h._M_single_bucket);
    if ((_Rb_tree_header *)splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count != p_Var3) {
      operator_delete((void *)splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
    }
    ::wasm::PassRunner::~PassRunner
              ((PassRunner *)
               &options.usedOptions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    auVar8._8_8_ = wasm.name.super_IString.str._M_len;
    auVar8._0_4_ = wasm.features.features;
    auVar8[4] = wasm.hasFeaturesSection;
    auVar8._5_3_ = wasm._381_3_;
    if (splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
        (_Base_ptr)psVar1) {
      operator_delete(splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_left,splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count + 1);
      auVar8._8_8_ = wasm.name.super_IString.str._M_len;
      auVar8._0_4_ = wasm.features.features;
      auVar8[4] = wasm.hasFeaturesSection;
      auVar8._5_3_ = wasm._381_3_;
    }
    break;
  case 3:
    anon_unknown.dwarf_3e821::readProfile
              ((ProfileData *)
               &options.usedOptions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)options._560_8_);
    auStack_108 = (undefined1  [8])0x0;
    splitResults.secondary._M_t.
    super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
    super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Module,_std::default_delete<wasm::Module>,_true,_true>)
         (__uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>)0x0;
    splitResults.placeholderMap._M_t._M_impl._0_8_ = 0;
    if (options.mode._2_1_ == 1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_108,
                 keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ -
                 CONCAT44(keepFuncs_1._M_t._M_impl._4_4_,keepFuncs_1._M_t._M_impl._0_4_) >> 3);
      lVar25 = keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ -
               CONCAT44(keepFuncs_1._M_t._M_impl._4_4_,keepFuncs_1._M_t._M_impl._0_4_);
      if (lVar25 != 0) {
        lVar25 = lVar25 >> 3;
        lVar29 = 0;
        do {
          if (*(long *)(CONCAT44(keepFuncs_1._M_t._M_impl._4_4_,keepFuncs_1._M_t._M_impl._0_4_) +
                       lVar29 * 8) != 0) {
            *(_Base_ptr *)((long)auStack_108 + lVar29 * 8) = (_Base_ptr)0x1;
          }
          lVar29 = lVar29 + 1;
        } while (lVar25 + (ulong)(lVar25 == 0) != lVar29);
      }
    }
    file = (string *)options._560_8_;
    pbVar22 = options.inputFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (0x20 < (ulong)((long)options.inputFiles.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start - options._560_8_)) {
      uVar27 = 1;
      do {
        lVar25 = uVar27 * 0x20;
        anon_unknown.dwarf_3e821::readProfile
                  ((ProfileData *)auStack_388,(string *)(options._560_8_ + lVar25));
        if (auStack_388 !=
            (undefined1  [8])
            options.usedOptions.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::wasm::Fatal::Fatal((Fatal *)local_f30);
          ppuVar6 = &wasm.exports.
                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppuVar6,"Checksum in profile ",0x14);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppuVar6,*(char **)(options._560_8_ + lVar25),
                     *(long *)(options._560_8_ + 8 + lVar25));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppuVar6," does not match hash in profile ",0x20);
          ::wasm::Fatal::operator<<
                    ((Fatal *)local_f30,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     options._560_8_);
          goto LAB_0010fc44;
        }
        puVar18 = (ulong *)CONCAT44(keepFuncs_1._M_t._M_impl._4_4_,keepFuncs_1._M_t._M_impl._0_4_);
        if (splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ -
            splitFuncs_1._M_t._M_impl._0_8_ !=
            keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ - (long)puVar18) {
          ::wasm::Fatal::Fatal((Fatal *)local_f30);
          ppuVar6 = &wasm.exports.
                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppuVar6,"Profile ",8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppuVar6,*(char **)(options._560_8_ + lVar25),
                     *(long *)(options._560_8_ + 8 + lVar25));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppuVar6," incompatible with profile ",0x1b);
          ::wasm::Fatal::operator<<
                    ((Fatal *)local_f30,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     options._560_8_);
          goto LAB_0010fc44;
        }
        if ((ulong *)keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != puVar18) {
          lVar25 = keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ - (long)puVar18 >>
                   3;
          lVar25 = lVar25 + (ulong)(lVar25 == 0);
          auVar30 = auStack_108;
          puVar32 = (ulong *)splitFuncs_1._M_t._M_impl._0_8_;
          do {
            if ((*puVar18 == 0) || (*puVar32 == 0)) {
              uVar34 = *puVar32;
              if (uVar34 != 0) goto LAB_0010ecf2;
            }
            else {
              puVar33 = puVar18;
              if (*puVar32 < *puVar18) {
                puVar33 = puVar32;
              }
              uVar34 = *puVar33;
LAB_0010ecf2:
              *puVar18 = uVar34;
            }
            if ((options.mode._2_1_ != Split >> 0x10) && (*puVar32 != 0)) {
              (((Module *)auVar30)->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)((long)&((_Base_ptr)
                                    (((Module *)auVar30)->exports).
                                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_color + 1);
            }
            puVar32 = puVar32 + 1;
            auVar30 = (undefined1  [8])
                      &(((Module *)auVar30)->exports).
                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            puVar18 = puVar18 + 1;
            lVar25 = lVar25 + -1;
          } while (lVar25 != 0);
        }
        if (splitFuncs_1._M_t._M_impl._0_8_ != 0) {
          operator_delete((void *)splitFuncs_1._M_t._M_impl._0_8_,
                          (long)splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                          - splitFuncs_1._M_t._M_impl._0_8_);
        }
        uVar27 = uVar27 + 1;
        file = (string *)options._560_8_;
        pbVar22 = options.inputFiles.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar27 < (ulong)((long)options.inputFiles.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start - options._560_8_ >>
                               5));
    }
    if ((file != pbVar22) && (options.mode._2_1_ != Split >> 0x10)) {
      do {
        anon_unknown.dwarf_3e821::readProfile((ProfileData *)local_f30,file);
        if ((long)wasm.exports.
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)wasm.exports.
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0) {
          lVar25 = (long)wasm.exports.
                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)wasm.exports.
                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3;
          lVar29 = 0;
          do {
            if ((wasm.exports.
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar29]._M_t.
                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                 super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl != (Export *)0x0) &&
               (*(_Base_ptr *)((long)auStack_108 + lVar29 * 8) == (_Base_ptr)0x1))
            goto LAB_0010edf2;
            lVar29 = lVar29 + 1;
          } while (lVar25 + (ulong)(lVar25 == 0) != lVar29);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Profile ",8);
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(file->_M_dataplus)._M_p,file->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar19," only includes functions included in other profiles.\n",0x35);
LAB_0010edf2:
        if (wasm.exports.
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(wasm.exports.
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)wasm.exports.
                                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)wasm.exports.
                                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        file = file + 1;
      } while (file != pbVar22);
    }
    auStack_388 = (undefined1  [8])0x0;
    splitFuncs_1._M_t._M_impl._0_8_ = 0;
    splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    ::wasm::BufferWithRandomAccess::operator<<
              ((BufferWithRandomAccess *)auStack_388,
               (int64_t)options.usedOptions.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    lVar25 = CONCAT44(keepFuncs_1._M_t._M_impl._4_4_,keepFuncs_1._M_t._M_impl._0_4_);
    if (keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != lVar25) {
      uVar27 = 0;
      do {
        ::wasm::BufferWithRandomAccess::operator<<
                  ((BufferWithRandomAccess *)auStack_388,*(int32_t *)(lVar25 + uVar27 * 8));
        uVar27 = uVar27 + 1;
        lVar25 = CONCAT44(keepFuncs_1._M_t._M_impl._4_4_,keepFuncs_1._M_t._M_impl._0_4_);
      } while (uVar27 < (ulong)(keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ -
                                lVar25 >> 3));
    }
    ::wasm::Output::Output
              ((Output *)local_f30,
               (string *)
               &options.inputFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,Binary);
    uVar13 = splitFuncs_1._M_t._M_impl._0_8_;
    if (auStack_388 != (undefined1  [8])splitFuncs_1._M_t._M_impl._0_8_) {
      auVar30 = auStack_388;
      do {
        splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count =
             CONCAT71(splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_,
                      *(undefined1 *)&(((pointer)auVar30)->_M_dataplus)._M_p);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&wasm.typeIndices._M_h._M_single_bucket,
                   (char *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,1);
        auVar30 = (undefined1  [8])((long)&(((pointer)auVar30)->_M_dataplus)._M_p + 1);
      } while (auVar30 != (undefined1  [8])uVar13);
    }
    ::wasm::Output::~Output((Output *)local_f30);
    if (auStack_388 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_388,
                      splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ -
                      (long)auStack_388);
    }
    if (auStack_108 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_108,
                      splitResults.placeholderMap._M_t._M_impl._0_8_ - (long)auStack_108);
    }
    auVar43._8_8_ = wasm.name.super_IString.str._M_len;
    auVar43._0_4_ = wasm.features.features;
    auVar43[4] = wasm.hasFeaturesSection;
    auVar43._5_3_ = wasm._381_3_;
    uVar13 = CONCAT44(keepFuncs_1._M_t._M_impl._4_4_,keepFuncs_1._M_t._M_impl._0_4_);
    if ((void *)uVar13 == (void *)0x0) goto switchD_0010db45_default;
    uVar27 = (long)keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent - uVar13;
    goto LAB_0010ef2b;
  case 4:
    p_Var3 = &splitFuncs._M_t._M_impl.super__Rb_tree_header;
    __str_1.field_2._8_8_ = p_Var3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&__str_1.field_2 + 8),*(long *)options._560_8_,
               *(long *)(options._560_8_ + 8) + *(long *)options._560_8_);
    anon_unknown.dwarf_3e821::checkExists((string *)&options.usePlaceholders);
    anon_unknown.dwarf_3e821::checkExists((string *)((long)&__str_1.field_2 + 8));
    ::wasm::Module::Module((Module *)local_f30);
    pp_Var2 = &wasm.tagsMap._M_h._M_single_bucket;
    anon_unknown.dwarf_3e821::parseInput((Module *)local_f30,(WasmSplitOptions *)pp_Var2);
    keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&keepFuncs_1;
    keepFuncs_1._M_t._M_impl._0_4_ = 0;
    keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&splitFuncs_1;
    splitFuncs_1._M_t._M_impl._0_8_ = (ulong)(uint)splitFuncs_1._M_t._M_impl._4_4_ << 0x20;
    splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         splitFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    uVar16 = anon_unknown.dwarf_3e821::hashFile((string *)((long)&__str_1.field_2 + 8));
    anon_unknown.dwarf_3e821::getFunctionsToKeepAndSplit
              ((Module *)local_f30,uVar16,(string *)&options.usePlaceholders,
               (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
               &options.usedOptions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)auStack_388);
    local_1d8 = (undefined1  [8])pp_Var2;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Keeping functions: ",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                *)auStack_108,
               (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                *)&options.usedOptions.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    currModule._M_string_length._0_1_ = 0x2b;
    currModule._M_string_length._1_1_ = 0;
    currModule._M_dataplus._M_p = (pointer)0x1;
    local_188 = (undefined1  [8])&currModule._M_string_length;
    (anonymous_namespace)::printReadableProfile(wasm::WasmSplitOptions_const&)::$_0::operator()
              (local_1d8,
               (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)auStack_108,
               (string *)local_188);
    if (local_188 != (undefined1  [8])&currModule._M_string_length) {
      operator_delete((void *)local_188,
                      CONCAT62(currModule._M_string_length._2_6_,
                               CONCAT11(currModule._M_string_length._1_1_,
                                        (undefined1)currModule._M_string_length)) + 1);
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)auStack_108);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Splitting out functions: ",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                *)auStack_388);
    line._M_string_length._0_1_ = 0x2d;
    line._M_string_length._1_1_ = 0;
    line._M_dataplus._M_p = (pointer)0x1;
    __str.field_2._8_8_ = &line._M_string_length;
    (anonymous_namespace)::printReadableProfile(wasm::WasmSplitOptions_const&)::$_0::operator()
              (local_1d8,
               (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
               &splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (string *)((long)&__str.field_2 + 8));
    if ((size_type *)__str.field_2._8_8_ != &line._M_string_length) {
      operator_delete((void *)__str.field_2._8_8_,
                      CONCAT62(line._M_string_length._2_6_,
                               CONCAT11(line._M_string_length._1_1_,
                                        (undefined1)line._M_string_length)) + 1);
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)auStack_388);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&options.usedOptions.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::wasm::Module::~Module((Module *)local_f30);
    auVar43._8_8_ = wasm.name.super_IString.str._M_len;
    auVar43._0_4_ = wasm.features.features;
    auVar43[4] = wasm.hasFeaturesSection;
    auVar43._5_3_ = wasm._381_3_;
    if ((_Rb_tree_header *)__str_1.field_2._8_8_ == p_Var3) goto switchD_0010db45_default;
    uVar27 = splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1;
    uVar13 = __str_1.field_2._8_8_;
LAB_0010ef2b:
    operator_delete((void *)uVar13,uVar27);
    auVar43._8_8_ = wasm.name.super_IString.str._M_len;
    auVar43._0_4_ = wasm.features.features;
    auVar43[4] = wasm.hasFeaturesSection;
    auVar43._5_3_ = wasm._381_3_;
  default:
    goto switchD_0010db45_default;
  }
  wasm._376_16_ = auVar8;
  ::wasm::Module::~Module((Module *)local_f30);
  auVar43 = (undefined1  [16])wasm._376_16_;
switchD_0010db45_default:
  wasm._376_16_ = auVar43;
  ::wasm::WasmSplitOptions::~WasmSplitOptions
            ((WasmSplitOptions *)&wasm.tagsMap._M_h._M_single_bucket);
  return 0;
}

Assistant:

int main(int argc, const char* argv[]) {
  WasmSplitOptions options;
  options.parse(argc, argv);

  if (!options.validate()) {
    Fatal() << "Invalid command line arguments";
  }

  switch (options.mode) {
    case WasmSplitOptions::Mode::Split:
      splitModule(options);
      break;
    case WasmSplitOptions::Mode::MultiSplit:
      multiSplitModule(options);
      break;
    case WasmSplitOptions::Mode::Instrument:
      instrumentModule(options);
      break;
    case WasmSplitOptions::Mode::MergeProfiles:
      mergeProfiles(options);
      break;
    case WasmSplitOptions::Mode::PrintProfile:
      printReadableProfile(options);
      break;
  }
}